

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::(anonymous_namespace)::set_value_integer<unsigned_int,char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,uint value,bool negative)

{
  bool bVar1;
  uint in_ECX;
  byte in_R8B;
  char_t *begin;
  char_t *end;
  char_t buf [64];
  size_t in_stack_ffffffffffffff98;
  char_t *in_stack_ffffffffffffffa0;
  uintptr_t in_stack_ffffffffffffffa8;
  unsigned_long *in_stack_ffffffffffffffb0;
  char **in_stack_ffffffffffffffb8;
  char_t acStack_28 [11];
  undefined1 local_1d;
  
  local_1d = in_R8B & 1;
  anon_unknown_0::integer_to_string<unsigned_int>
            (&stack0xffffffffffffff98,acStack_28,in_ECX,(bool)local_1d);
  bVar1 = strcpy_insitu<char*,unsigned_long>
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                     in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return bVar1;
}

Assistant:

PUGI_IMPL_FN bool set_value_integer(String& dest, Header& header, uintptr_t header_mask, U value, bool negative)
	{
		char_t buf[64];
		char_t* end = buf + sizeof(buf) / sizeof(buf[0]);
		char_t* begin = integer_to_string(buf, end, value, negative);

		return strcpy_insitu(dest, header, header_mask, begin, end - begin);
	}